

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

float64 log_full_eval(vector_t obs,float32 norm,vector_t mean,vector_t *var_inv,uint32 veclen)

{
  void *ptr;
  void *ptr_00;
  uint local_50;
  uint local_4c;
  uint32 j;
  uint32 i;
  float64 d;
  float64 *vtmp;
  float64 *diff;
  uint32 veclen_local;
  vector_t *var_inv_local;
  vector_t mean_local;
  float32 norm_local;
  vector_t obs_local;
  
  _j = (double)(float)norm;
  ptr = __ckd_malloc__((ulong)veclen << 3,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                       ,0x370);
  for (local_4c = 0; local_4c < veclen; local_4c = local_4c + 1) {
    *(double *)((long)ptr + (ulong)local_4c * 8) = (double)(obs[local_4c] - mean[local_4c]);
  }
  ptr_00 = __ckd_calloc__((ulong)veclen,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x378);
  for (local_4c = 0; local_4c < veclen; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < veclen; local_50 = local_50 + 1) {
      *(double *)((long)ptr_00 + (ulong)local_50 * 8) =
           (double)var_inv[local_4c][local_50] * *(double *)((long)ptr + (ulong)local_4c * 8) +
           *(double *)((long)ptr_00 + (ulong)local_50 * 8);
    }
  }
  for (local_4c = 0; local_4c < veclen; local_4c = local_4c + 1) {
    _j = -(*(double *)((long)ptr + (ulong)local_4c * 8) * 0.5) *
         *(double *)((long)ptr_00 + (ulong)local_4c * 8) + _j;
  }
  ckd_free(ptr_00);
  ckd_free(ptr);
  return (float64)_j;
}

Assistant:

float64
log_full_eval(vector_t obs,
	      float32 norm,
	      vector_t mean,
	      vector_t *var_inv,
	      uint32 veclen)
{
    float64 *diff, *vtmp, d;
    uint32 i, j;
    
    d = norm;

    /* Precompute x-m */
    diff = ckd_malloc(veclen * sizeof(float64));
    for (i = 0; i < veclen; i++)
	diff[i] = obs[i] - mean[i];

    /* Compute -0.5 * (x-m) * sigma^-1 * (x-m)^T */
    /* FIXME: We could probably use BLAS for this, though it is
     * unclear if that would actually be faster (particularly with
     * refblas) */
    vtmp = ckd_calloc(veclen, sizeof(float64));
    for (i = 0; i < veclen; ++i)
	for (j = 0; j < veclen; ++j)
	    vtmp[j] += var_inv[i][j] * diff[i];
    for (i = 0; i < veclen; ++i)
	d -= 0.5 * diff[i] * vtmp[i];
    ckd_free(vtmp);
    ckd_free(diff);

    return d;
}